

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O3

Matrix * __thiscall maths::Matrix::operator+=(Matrix *this,Matrix *m)

{
  int iVar1;
  uint uVar2;
  double **ppdVar3;
  double **ppdVar4;
  double *pdVar5;
  double *pdVar6;
  long lVar7;
  ulong uVar8;
  
  iVar1 = this->rows_;
  if (0 < (long)iVar1) {
    uVar2 = this->cols_;
    ppdVar3 = m->p;
    ppdVar4 = this->p;
    lVar7 = 0;
    do {
      if (0 < (int)uVar2) {
        pdVar5 = ppdVar3[lVar7];
        pdVar6 = ppdVar4[lVar7];
        uVar8 = 0;
        do {
          pdVar6[uVar8] = pdVar5[uVar8] + pdVar6[uVar8];
          uVar8 = uVar8 + 1;
        } while (uVar2 != uVar8);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != iVar1);
  }
  return this;
}

Assistant:

Matrix& Matrix::operator+=(const Matrix& m)
{
    for (int i = 0; i < rows_; ++i) {
        for (int j = 0; j < cols_; ++j) {
            p[i][j] += m.p[i][j];
        }
    }
    return *this;
}